

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktMemoryAllocationTests.cpp
# Opt level: O1

void __thiscall
vkt::memory::anon_unknown_0::RandomAllocFreeTestInstance::~RandomAllocFreeTestInstance
          (RandomAllocFreeTestInstance *this)

{
  long lVar1;
  VkDevice pVVar2;
  DeviceInterface *pDVar3;
  pointer pHVar4;
  pointer pMVar5;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  
  (this->super_TestInstance)._vptr_TestInstance =
       (_func_int **)&PTR__RandomAllocFreeTestInstance_00d5cc50;
  pVVar2 = Context::getDevice((this->super_TestInstance).m_context);
  pDVar3 = Context::getDeviceInterface((this->super_TestInstance).m_context);
  pHVar4 = (this->m_heaps).
           super__Vector_base<vkt::memory::(anonymous_namespace)::Heap,_std::allocator<vkt::memory::(anonymous_namespace)::Heap>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((int)((ulong)((long)(this->m_heaps).
                          super__Vector_base<vkt::memory::(anonymous_namespace)::Heap,_std::allocator<vkt::memory::(anonymous_namespace)::Heap>_>
                          ._M_impl.super__Vector_impl_data._M_finish - (long)pHVar4) >> 4) *
      -0x33333333 != 0) {
    uVar8 = 0;
    do {
      pMVar5 = *(pointer *)
                &pHVar4[uVar8].objects.
                 super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryObject,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryObject>_>
                 ._M_impl;
      if (pHVar4[uVar8].objects.
          super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryObject,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryObject>_>
          ._M_impl.super__Vector_impl_data._M_finish != pMVar5) {
        lVar7 = 0;
        uVar6 = 0;
        do {
          lVar1 = *(long *)((long)&(pMVar5->memory).m_internal + lVar7);
          if (lVar1 != 0) {
            (*pDVar3->_vptr_DeviceInterface[6])(pDVar3,pVVar2,lVar1,0);
          }
          uVar6 = uVar6 + 1;
          pMVar5 = pHVar4[uVar8].objects.
                   super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryObject,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryObject>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          lVar7 = lVar7 + 0x10;
        } while (uVar6 < (ulong)((long)pHVar4[uVar8].objects.
                                       super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryObject,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryObject>_>
                                       ._M_impl.super__Vector_impl_data._M_finish - (long)pMVar5 >>
                                4));
      }
      uVar8 = uVar8 + 1;
      pHVar4 = (this->m_heaps).
               super__Vector_base<vkt::memory::(anonymous_namespace)::Heap,_std::allocator<vkt::memory::(anonymous_namespace)::Heap>_>
               ._M_impl.super__Vector_impl_data._M_start;
    } while (uVar8 < (uint)((int)((ulong)((long)(this->m_heaps).
                                                super__Vector_base<vkt::memory::(anonymous_namespace)::Heap,_std::allocator<vkt::memory::(anonymous_namespace)::Heap>_>
                                                ._M_impl.super__Vector_impl_data._M_finish -
                                         (long)pHVar4) >> 4) * -0x33333333));
  }
  std::
  vector<vkt::memory::(anonymous_namespace)::Heap,_std::allocator<vkt::memory::(anonymous_namespace)::Heap>_>
  ::~vector(&this->m_heaps);
  return;
}

Assistant:

RandomAllocFreeTestInstance::~RandomAllocFreeTestInstance (void)
{
	const VkDevice							device				= m_context.getDevice();
	const DeviceInterface&					vkd					= m_context.getDeviceInterface();

	for (deUint32 heapNdx = 0; heapNdx < (deUint32)m_heaps.size(); heapNdx++)
	{
		const Heap&	heap	= m_heaps[heapNdx];

		for (size_t objectNdx = 0; objectNdx < heap.objects.size(); objectNdx++)
		{
			if (!!heap.objects[objectNdx].memory)
				vkd.freeMemory(device, heap.objects[objectNdx].memory, (const VkAllocationCallbacks*)DE_NULL);
		}
	}
}